

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_equals(bitset_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  bitset_container_t *in_stack_000000b8;
  bitset_container_t *in_stack_000000c0;
  bitset_container_t *container2_local;
  bitset_container_t *container1_local;
  
  if ((container1->cardinality != -1) && (container2->cardinality != -1)) {
    if (container1->cardinality != container2->cardinality) {
      return false;
    }
    if (container1->cardinality == 0x10000) {
      return true;
    }
  }
  _Var1 = croaring_avx2();
  if (_Var1) {
    container1_local._7_1_ = _avx2_bitset_container_equals(in_stack_000000c0,in_stack_000000b8);
  }
  else {
    container1_local._7_1_ = true;
  }
  return container1_local._7_1_;
}

Assistant:

bool bitset_container_equals(const bitset_container_t *container1, const bitset_container_t *container2) {
	if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
		if(container1->cardinality != container2->cardinality) {
			return false;
		}
    if (container1->cardinality == INT32_C(0x10000)) {
        return true;
    }
	}
#ifdef CROARING_IS_X64
  if( croaring_avx2() ) {
    return _avx2_bitset_container_equals(container1, container2);
  }
#else
  return memcmp(container1->words,
                container2->words,
                BITSET_CONTAINER_SIZE_IN_WORDS*sizeof(uint64_t)) == 0;
#endif
	return true;
}